

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

bool __thiscall cppcms::xss::rules::valid_entity(rules *this,c_string *val)

{
  data *pdVar1;
  const_iterator cVar2;
  data *pdVar3;
  
  pdVar1 = (this->d).ptr_;
  pdVar3 = (data *)&pdVar1->html_rules;
  if (pdVar1->is_xhtml != false) {
    pdVar3 = pdVar1;
  }
  cVar2 = std::
          _Rb_tree<cppcms::xss::details::c_string,_cppcms::xss::details::c_string,_std::_Identity<cppcms::xss::details::c_string>,_cppcms::xss::compare_c_string,_std::allocator<cppcms::xss::details::c_string>_>
          ::find(&(pdVar3->xhtml_rules).super_basic_rules_holder.entities._M_t,val);
  return (_Rb_tree_header *)cVar2._M_node !=
         &(pdVar3->xhtml_rules).super_basic_rules_holder.entities._M_t._M_impl.super__Rb_tree_header
  ;
}

Assistant:

bool operator()(char const *b,char const *e) const
		{
			return booster::regex_match(b,e,r_);
		}